

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O2

bool __thiscall
AllocationPolicyManager::RequestAlloc
          (AllocationPolicyManager *this,size_t byteCount,bool externalAlloc)

{
  bool bVar1;
  AutoCriticalSection local_28;
  AutoCriticalSection auto_cs;
  
  if (this->supportConcurrency == true) {
    local_28.cs = &this->cs;
    CCLock::Enter(&(local_28.cs)->super_CCLock);
    bVar1 = RequestAllocImpl(this,byteCount,externalAlloc);
    AutoCriticalSection::~AutoCriticalSection(&local_28);
    return bVar1;
  }
  bVar1 = RequestAllocImpl(this,byteCount,externalAlloc);
  return bVar1;
}

Assistant:

bool RequestAlloc(DECLSPEC_GUARD_OVERFLOW size_t byteCount, bool externalAlloc = false)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            return RequestAllocImpl(byteCount, externalAlloc);
        }
        else
        {
            return RequestAllocImpl(byteCount, externalAlloc);
        }
    }